

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
extract_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t **chunktable,
                   uint64_t *chunkminoffset)

{
  int iVar1;
  bool bVar2;
  exr_result_t eVar3;
  uint64_t *chunktable_00;
  uint64_t *puVar4;
  ulong uVar5;
  undefined8 unaff_RBP;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  uint64_t chunkoff;
  int64_t nread;
  uint64_t local_40 [2];
  
  local_40[0] = part->chunk_table_offset;
  iVar1 = part->chunk_count;
  *chunkminoffset = local_40[0] + (long)iVar1 * 8;
  chunktable_00 = (uint64_t *)part->chunk_table;
  if (chunktable_00 != (uint64_t *)0x0) goto LAB_00121f19;
  local_40[1] = 0;
  if (part->chunk_count < 1) {
    eVar3 = (*ctxt->report_error)(ctxt,3,"Invalid file with no chunks");
LAB_00121f11:
    bVar2 = false;
    chunktable_00 = (uint64_t *)0x0;
  }
  else {
    sVar7 = (long)iVar1 * 8;
    if ((0 < ctxt->file_size) && ((ulong)ctxt->file_size < local_40[0] + sVar7)) {
      eVar3 = (*ctxt->print_error)
                        (ctxt,3,"chunk table size (%lu) too big for file size (%ld)",sVar7);
      goto LAB_00121f11;
    }
    chunktable_00 = (uint64_t *)(*ctxt->alloc_fn)(sVar7);
    if (chunktable_00 == (uint64_t *)0x0) {
LAB_00121f00:
      eVar3 = (*ctxt->standard_error)(ctxt,1);
      goto LAB_00121f11;
    }
    eVar3 = (*ctxt->do_read)(ctxt,chunktable_00,sVar7,local_40,(int64_t *)(local_40 + 1),
                             EXR_MUST_READ_ALL);
    if (eVar3 == 0) {
      if (ctxt->disable_chunk_reconstruct == '\0') {
        uVar5 = 0xffffffffffffffff;
        if (0 < ctxt->file_size) {
          uVar5 = ctxt->file_size;
        }
        if (0 < (long)part->chunk_count) {
          bVar8 = true;
          lVar6 = 0;
          do {
            if (uVar5 <= chunktable_00[lVar6]) {
              bVar8 = false;
            }
            if (chunktable_00[lVar6] < local_40[0]) {
              bVar8 = false;
            }
            lVar6 = lVar6 + 1;
          } while (part->chunk_count != lVar6);
          if (((!bVar8) && (eVar3 = reconstruct_chunk_table(ctxt,part,chunktable_00), eVar3 != 0))
             && (ctxt->strict_header != '\0')) {
            (*ctxt->free_fn)(chunktable_00);
            eVar3 = (*ctxt->report_error)
                              (ctxt,0x16,"Incomplete / corrupt chunk table, unable to reconstruct");
            goto LAB_00121eb0;
          }
        }
      }
      LOCK();
      puVar4 = (uint64_t *)part->chunk_table;
      bVar8 = puVar4 == (uint64_t *)0x0;
      if (bVar8) {
        part->chunk_table = (atomic_uintptr_t)chunktable_00;
        puVar4 = (uint64_t *)0x0;
      }
      UNLOCK();
      eVar3 = (exr_result_t)CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar8);
      bVar2 = true;
      if ((!bVar8) && ((*ctxt->free_fn)(chunktable_00), chunktable_00 = puVar4, bVar8))
      goto LAB_00121f00;
    }
    else {
      (*ctxt->free_fn)(chunktable_00);
LAB_00121eb0:
      bVar2 = false;
    }
  }
  if (!bVar2) {
    return eVar3;
  }
LAB_00121f19:
  *chunktable = chunktable_00;
  return 0;
}

Assistant:

static exr_result_t
extract_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t**                          chunktable,
    uint64_t*                           chunkminoffset)
{
    uint64_t* ctable     = NULL;
    uint64_t  chunkoff   = part->chunk_table_offset;
    uint64_t  chunkbytes = sizeof (uint64_t) * (uint64_t) part->chunk_count;

    *chunkminoffset = chunkoff + chunkbytes;

#if defined(_MSC_VER)
    ctable = (uint64_t*) InterlockedOr64 (
        (int64_t volatile*) &(part->chunk_table), 0);
#else
    ctable = (uint64_t*) atomic_load (
        EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)));
#endif
    
    if (ctable == NULL)
    {
        int64_t      nread = 0;
        uintptr_t    eptr = 0, nptr = 0;
        int          complete = 1;
        uint64_t     maxoff   = ((uint64_t) -1);
        exr_result_t rv;

        if (part->chunk_count <= 0)
            return ctxt->report_error (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file with no chunks");

        if (ctxt->file_size > 0 &&
            chunkbytes + chunkoff > (uint64_t) ctxt->file_size)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "chunk table size (%" PRIu64 ") too big for file size (%" PRId64
                ")",
                chunkbytes,
                ctxt->file_size);

        ctable = (uint64_t*) ctxt->alloc_fn (chunkbytes);
        if (ctable == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        rv = ctxt->do_read (
            ctxt, ctable, chunkbytes, &chunkoff, &nread, EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS)
        {
            ctxt->free_fn (ctable);
            return rv;
        }

        if (!ctxt->disable_chunk_reconstruct)
        {
            // could convert table all at once, but need to check if the
            // file is incomplete (i.e. crashed during write and didn't
            // get a complete chunk table), so just do them one at a time
            if (ctxt->file_size > 0) maxoff = (uint64_t) ctxt->file_size;
            for (int ci = 0; ci < part->chunk_count; ++ci)
            {
                uint64_t cchunk = one_to_native64 (ctable[ci]);
                if (cchunk < chunkoff || cchunk >= maxoff) complete = 0;
                ctable[ci] = cchunk;
            }

            if (!complete)
            {
                // The c++ side would basically fail as soon as it
                // failed, but would otherwise swallow all errors, and
                // then just let the reads fail later. We will do
                // something similar, except when in strict mode, we
                // will fail with a corrupt chunk immediately.
                rv = reconstruct_chunk_table (ctxt, part, ctable);
                if (rv != EXR_ERR_SUCCESS && ctxt->strict_header)
                {
                    ctxt->free_fn (ctable);
                    return ctxt->report_error (
                        ctxt,
                        EXR_ERR_BAD_CHUNK_LEADER,
                        "Incomplete / corrupt chunk table, unable to reconstruct");
                }
            }
        }
        else { priv_to_native64 (ctable, part->chunk_count); }

        nptr = (uintptr_t) ctable;
        // see if we win or not
        if (!atomic_compare_exchange_strong (
                EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)),
                &eptr,
                nptr))
        {
            ctxt->free_fn (ctable);
            ctable = (uint64_t*) eptr;
            if (ctable == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
    }

    *chunktable = ctable;
    return EXR_ERR_SUCCESS;
}